

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Builder * __thiscall
capnp::LocalCallContext::getResults
          (Builder *__return_storage_ptr__,LocalCallContext *this,
          Maybe<capnp::MessageSize> *sizeHint)

{
  CapTableBuilder *pCVar1;
  Own<capnp::LocalResponse,_std::nullptr_t> localResponse;
  Own<capnp::LocalResponse,_std::nullptr_t> local_88;
  Own<capnp::ResponseHook,_std::nullptr_t> local_78;
  Response<capnp::AnyPointer> local_68;
  SegmentReader *local_38;
  CapTableReader *pCStack_30;
  WirePointer *local_28;
  int iStack_20;
  undefined4 uStack_1c;
  
  if ((this->response).ptr.isSet == false) {
    kj::heap<capnp::LocalResponse,kj::Maybe<capnp::MessageSize>&>((kj *)&local_88,sizeHint);
    MessageBuilder::getRootInternal
              ((Builder *)&local_68,&((local_88.ptr)->message).super_MessageBuilder);
    (this->responseBuilder).builder.pointer = local_68.super_Reader.reader.pointer;
    (this->responseBuilder).builder.segment = (SegmentBuilder *)local_68.super_Reader.reader.segment
    ;
    (this->responseBuilder).builder.capTable =
         (CapTableBuilder *)local_68.super_Reader.reader.capTable;
    capnp::_::PointerBuilder::asReader(&(this->responseBuilder).builder);
    local_68.hook.ptr = &(local_88.ptr)->super_ResponseHook;
    local_88.ptr = (LocalResponse *)0x0;
    local_78.disposer = local_88.disposer;
    local_68.super_Reader.reader.segment = local_38;
    local_68.super_Reader.reader.capTable = pCStack_30;
    local_68.super_Reader.reader.pointer = local_28;
    local_68.super_Reader.reader.nestingLimit = iStack_20;
    local_68.super_Reader.reader._28_4_ = uStack_1c;
    local_68.hook.disposer = local_88.disposer;
    local_78.ptr = (ResponseHook *)0x0;
    kj::_::NullableValue<capnp::Response<capnp::AnyPointer>>::
    emplace<capnp::Response<capnp::AnyPointer>>
              ((NullableValue<capnp::Response<capnp::AnyPointer>> *)&this->response,&local_68);
    kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&local_68.hook);
    kj::Own<capnp::ResponseHook,_std::nullptr_t>::dispose(&local_78);
    kj::Own<capnp::LocalResponse,_std::nullptr_t>::dispose(&local_88);
  }
  (__return_storage_ptr__->builder).pointer = (this->responseBuilder).builder.pointer;
  pCVar1 = (this->responseBuilder).builder.capTable;
  (__return_storage_ptr__->builder).segment = (this->responseBuilder).builder.segment;
  (__return_storage_ptr__->builder).capTable = pCVar1;
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
    if (response == kj::none) {
      auto localResponse = kj::heap<LocalResponse>(sizeHint);
      responseBuilder = localResponse->message.getRoot<AnyPointer>();
      response = Response<AnyPointer>(responseBuilder.asReader(), kj::mv(localResponse));
    }
    return responseBuilder;
  }